

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_proj.c
# Opt level: O0

int CVodeSetProjFailEta(void *cvode_mem,sunrealtype eta)

{
  double in_XMM0_Qa;
  CVodeProjMem proj_mem;
  CVodeMem cv_mem;
  int retval;
  CVodeMem *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  void *in_stack_ffffffffffffffd8;
  int local_4;
  
  local_4 = cvAccessProjMem(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,
                            in_stack_ffffffffffffffc8,(CVodeProjMem *)0x14418a);
  if (local_4 == 0) {
    if ((in_XMM0_Qa <= 0.0) || (1.0 < in_XMM0_Qa)) {
      in_stack_ffffffffffffffd0[0x38] = '\0';
      in_stack_ffffffffffffffd0[0x39] = '\0';
      in_stack_ffffffffffffffd0[0x3a] = '\0';
      in_stack_ffffffffffffffd0[0x3b] = '\0';
      in_stack_ffffffffffffffd0[0x3c] = '\0';
      in_stack_ffffffffffffffd0[0x3d] = '\0';
      in_stack_ffffffffffffffd0[0x3e] = -0x30;
      in_stack_ffffffffffffffd0[0x3f] = '?';
    }
    else {
      *(double *)(in_stack_ffffffffffffffd0 + 0x38) = in_XMM0_Qa;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVodeSetProjFailEta(void* cvode_mem, sunrealtype eta)
{
  int retval;
  CVodeMem cv_mem;
  CVodeProjMem proj_mem;

  /* Access memory structures */
  retval = cvAccessProjMem(cvode_mem, __func__, &cv_mem, &proj_mem);
  if (retval != CV_SUCCESS) { return (retval); }

  /* Set the step size reduction factor for a projection failure */
  if ((eta <= ZERO) || (eta > ONE))
  {
    /* Restore default */
    proj_mem->eta_pfail = PROJ_FAIL_ETA;
  }
  else
  {
    /* Update the eta value */
    proj_mem->eta_pfail = eta;
  }

  return (CV_SUCCESS);
}